

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BHeap.h
# Opt level: O0

NodeDistancePairClass * __thiscall
ADS::BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator>::changeElement
          (BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator> *this,
          BNode<ADS::NodeDistancePairClass_*> *pNode,NodeDistancePairClass *newElement)

{
  NodeDistancePairClass *pEl2;
  bool bVar1;
  NodeDistancePairClass *oldElement;
  NodeDistancePairClass *newElement_local;
  BNode<ADS::NodeDistancePairClass_*> *pNode_local;
  BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator> *this_local;
  
  pEl2 = (pNode->super_Node<ADS::NodeDistancePairClass_*>).el;
  (pNode->super_Node<ADS::NodeDistancePairClass_*>).el = newElement;
  bVar1 = ObjPointerComparator<ADS::NodeDistancePairClass>::greaterThan(newElement,pEl2);
  if (bVar1) {
    if ((this->_bIsMinHeap & 1U) == 0) {
      bubbleUp(this,pNode);
    }
    else {
      bubbleDown(this,pNode);
    }
  }
  else {
    bVar1 = ObjPointerComparator<ADS::NodeDistancePairClass>::lessThan(newElement,pEl2);
    if (bVar1) {
      if ((this->_bIsMinHeap & 1U) == 0) {
        bubbleDown(this,pNode);
      }
      else {
        bubbleUp(this,pNode);
      }
    }
  }
  return pEl2;
}

Assistant:

T BHeap<T, Comparator>::changeElement (BNode<T> *pNode, T newElement)
    {
        T oldElement = pNode->el;
        pNode->el = newElement;
        if (Comparator::greaterThan (newElement, oldElement))
            _bIsMinHeap ?  bubbleDown (pNode) : bubbleUp (pNode);
        else if (Comparator::lessThan (newElement, oldElement))
            _bIsMinHeap ? bubbleUp (pNode) : bubbleDown (pNode);

        return oldElement;
    }